

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_chop_u64(nng_msg *m,uint64_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  size_t sVar9;
  void *pvVar10;
  uint64_t v;
  uint8_t *body;
  uint64_t *vp_local;
  nng_msg *m_local;
  
  sVar9 = nni_msg_len(m);
  if (sVar9 < 8) {
    m_local._4_4_ = 3;
  }
  else {
    pvVar10 = nni_msg_body(m);
    sVar9 = nni_msg_len(m);
    bVar1 = *(byte *)((long)pvVar10 + (sVar9 - 8));
    bVar2 = *(byte *)((long)pvVar10 + (sVar9 - 7));
    bVar3 = *(byte *)((long)pvVar10 + (sVar9 - 6));
    bVar4 = *(byte *)((long)pvVar10 + (sVar9 - 5));
    bVar5 = *(byte *)((long)pvVar10 + (sVar9 - 4));
    bVar6 = *(byte *)((long)pvVar10 + (sVar9 - 3));
    bVar7 = *(byte *)((long)pvVar10 + (sVar9 - 2));
    bVar8 = *(byte *)((long)pvVar10 + (sVar9 - 1));
    nni_msg_chop(m,8);
    *vp = ((ulong)bVar1 << 0x38) + ((ulong)bVar2 << 0x30) + ((ulong)bVar3 << 0x28) +
          ((ulong)bVar4 << 0x20) + (ulong)bVar5 * 0x1000000 + (ulong)bVar6 * 0x10000 +
          (ulong)bVar7 * 0x100 + (ulong)bVar8;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nng_msg_chop_u64(nng_msg *m, uint64_t *vp)
{
	uint8_t *body;
	uint64_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET64(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}